

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_diagnostic.c
# Opt level: O1

int IoTHubClient_Diagnostic_AddIfNecessary
              (IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting,IOTHUB_MESSAGE_HANDLE messageHandle)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  IOTHUB_MESSAGE_RESULT IVar4;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData;
  char *__ptr;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *__s;
  time_t tVar5;
  LOGGER_LOG p_Var6;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  
  if (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 ||
      diagSetting == (IOTHUB_DIAGNOSTIC_SETTING_DATA *)0x0) {
    return 0xa1;
  }
  uVar7 = diagSetting->diagSamplingPercentage;
  if (uVar7 == 0) {
    return 0;
  }
  if (diagSetting->currentMessageNumber == 0xffffffff) {
    diagSetting->currentMessageNumber = (uint32_t)(0xffffffff % (ulong)(uVar7 * 100));
  }
  uVar2 = diagSetting->currentMessageNumber + 1;
  diagSetting->currentMessageNumber = uVar2;
  dVar13 = (double)uVar2;
  dVar12 = floor(((dVar13 + -2.0) * (double)uVar7) / 100.0);
  dVar13 = floor(((dVar13 + -1.0) * (double)uVar7) / 100.0);
  if (dVar13 <= dVar12) {
    return 0;
  }
  diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)malloc(0x10);
  if (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"prepare_message_diagnostic_data",0x71,1,"malloc for DiagnosticData failed");
      goto LAB_00125dc5;
    }
  }
  else {
    __ptr = (char *)malloc(9);
    if (__ptr == (char *)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                  ,"prepare_message_diagnostic_data",0x78,1,"malloc for diagId failed");
      }
    }
    else {
      lVar11 = 0;
      do {
        iVar3 = rand();
        uVar7 = (iVar3 / 0x24) % 0x24;
        bVar8 = (byte)(iVar3 % 0x24);
        bVar9 = bVar8 + 0x57;
        if ((uint)(iVar3 % 0x24) < 10) {
          bVar9 = bVar8 | 0x30;
        }
        bVar1 = (byte)uVar7;
        bVar8 = bVar1 + 0x57;
        if (uVar7 < 10) {
          bVar8 = bVar1 | 0x30;
        }
        __ptr[lVar11 * 2] = bVar9;
        __ptr[lVar11 * 2 + 1] = bVar8;
        lVar11 = lVar11 + 1;
      } while ((int)lVar11 != 4);
      __ptr[lVar11 * 2] = '\0';
      diagnosticData->diagnosticId = __ptr;
      __s = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)malloc(0x1e);
      if (__s == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                    ,"prepare_message_diagnostic_data",0x86,1,"malloc for timeBuffer failed");
        }
        free(__ptr);
      }
      else {
        tVar5 = get_time((time_t *)0x0);
        if (tVar5 == -1) {
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed getting current time";
            iVar3 = 0x1d;
LAB_00125d6b:
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                      ,"get_epoch_time",iVar3,1,pcVar10);
          }
        }
        else {
          iVar3 = sprintf((char *)__s,"%lu",tVar5);
          if (-1 < iVar3) {
            diagnosticData->diagnosticCreationTimeUtc = (char *)__s;
            goto LAB_00125dc5;
          }
          p_Var6 = xlogging_get_log_function();
          if (p_Var6 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed sprintf to timeBuffer with 8 bytes of time_t";
            iVar3 = 0x24;
            goto LAB_00125d6b;
          }
        }
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                    ,"prepare_message_diagnostic_data",0x8d,1,"Failed getting current time");
        }
        free(__ptr);
        free(diagnosticData);
        diagnosticData = __s;
      }
    }
    free(diagnosticData);
  }
  diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0;
LAB_00125dc5:
  if (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    iVar3 = 0xa9;
  }
  else {
    IVar4 = IoTHubMessage_SetDiagnosticPropertyData(messageHandle,diagnosticData);
    iVar3 = 0xaf;
    if (IVar4 == IOTHUB_MESSAGE_OK) {
      iVar3 = 0;
    }
    free(diagnosticData->diagnosticCreationTimeUtc);
    free(diagnosticData->diagnosticId);
    free(diagnosticData);
  }
  return iVar3;
}

Assistant:

int IoTHubClient_Diagnostic_AddIfNecessary(IOTHUB_DIAGNOSTIC_SETTING_DATA* diagSetting, IOTHUB_MESSAGE_HANDLE messageHandle)
{
    int result;
    if (diagSetting == NULL || messageHandle == NULL)
    {
        result = MU_FAILURE;
    }
    else if (should_add_diagnostic_info(diagSetting))
    {

        IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* diagnosticData;
        if ((diagnosticData = prepare_message_diagnostic_data()) == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (IoTHubMessage_SetDiagnosticPropertyData(messageHandle, diagnosticData) != IOTHUB_MESSAGE_OK)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            free(diagnosticData->diagnosticCreationTimeUtc);
            free(diagnosticData->diagnosticId);
            free(diagnosticData);
            diagnosticData = NULL;
        }
    }
    else
    {
        result = 0;
    }

    return result;
}